

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O1

bool rest_blockhash_by_height(any *context,HTTPRequest *req,string *str_uri_part)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer ppCVar3;
  uint256 *puVar4;
  string key;
  UniValue val;
  span<const_std::byte,_18446744073709551615UL> reply;
  span<const_std::byte,_18446744073709551615UL> reply_00;
  undefined1 auVar5 [8];
  bool bVar6;
  RESTResponseFormat RVar7;
  int iVar8;
  ChainstateManager *this;
  Chainstate *pCVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  size_type sVar12;
  mutex_type *pmVar13;
  pointer pcVar14;
  CBlockIndex *pCVar15;
  long in_FS_OFFSET;
  string_view str;
  span<const_std::byte,_18446744073709551615UL> reply_01;
  string_view str_00;
  int32_t blockheight;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  string height_str;
  undefined4 in_stack_fffffffffffffe08;
  uint uVar16;
  _Alloc_hider in_stack_fffffffffffffe10;
  _Alloc_hider _Var17;
  size_type in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  undefined8 uVar18;
  undefined8 in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  _Alloc_hider in_stack_fffffffffffffe38;
  size_type in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe50 [48];
  long *local_178 [2];
  long local_168 [2];
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [9];
  undefined4 local_13f;
  undefined2 local_13b;
  char local_139;
  undefined1 local_138 [8];
  bool bStack_130;
  undefined7 uStack_12f;
  undefined1 local_128 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  vector<UniValue,_std::allocator<UniValue>_> vStack_f8;
  undefined1 local_d8 [24];
  undefined1 auStack_c0 [8];
  undefined1 local_b8 [32];
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = CheckWarmup(req);
  if (!bVar6) {
    bVar6 = false;
    goto LAB_0029642d;
  }
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  RVar7 = ParseDataFormat(&local_58,str_uri_part);
  uVar16 = 0xffffffff;
  str._M_str = local_58._M_dataplus._M_p;
  str._M_len = local_58._M_string_length;
  bVar6 = ParseInt32(str,(int32_t *)&stack0xfffffffffffffe0c);
  if (bVar6 && -1 < (int)uVar16) {
    this = GetChainman(context,req);
    if (this == (ChainstateManager *)0x0) {
      pCVar15 = (CBlockIndex *)0x0;
      bVar6 = false;
    }
    else {
      local_138._0_4_ = 0xb43050;
      local_138._4_4_ = 0;
      bStack_130 = false;
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_138);
      pCVar9 = ChainstateManager::ActiveChainstate(this);
      ppCVar3 = (pCVar9->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar8 = (int)((ulong)((long)(pCVar9->m_chain).vChain.
                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3) >> 3);
      bVar6 = (int)uVar16 < iVar8;
      if ((int)uVar16 < iVar8) {
        if ((int)uVar16 < 0) goto LAB_00295e12;
        pCVar15 = ppCVar3[uVar16];
      }
      else {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Block height out of range","");
        RESTERR(req,HTTP_NOT_FOUND,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
LAB_00295e12:
        pCVar15 = (CBlockIndex *)0x0;
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)local_138);
    }
    local_138 = (undefined1  [8])CONCAT44(local_138._4_4_,local_138._0_4_);
    if (!bVar6) goto LAB_0029640e;
    if (RVar7 == BINARY) {
      local_128._0_8_ = 0;
      local_128[8] = '\0';
      local_128._9_7_ = 0;
      local_138._0_4_ = VNULL;
      local_138._4_4_ = 0;
      local_138 = (undefined1  [8])0x0;
      bStack_130 = false;
      uStack_12f = 0;
      puVar4 = pCVar15->phashBlock;
      if (puVar4 == (uint256 *)0x0) {
LAB_0029658f:
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      local_b8._0_4_ = *(undefined4 *)&puVar4->super_base_blob<256U>;
      local_b8._4_4_ = *(undefined4 *)((long)&puVar4->super_base_blob<256U> + 4);
      local_b8._8_4_ = *(undefined4 *)((long)&puVar4->super_base_blob<256U> + 8);
      local_b8._12_4_ = *(undefined4 *)((long)&puVar4->super_base_blob<256U> + 0xc);
      local_b8._16_8_ = *(undefined8 *)((long)&puVar4->super_base_blob<256U> + 0x10);
      local_b8._24_8_ = *(undefined8 *)((long)&puVar4->super_base_blob<256U> + 0x18);
      std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
                ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_138,0,local_b8);
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Content-Type","");
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"application/octet-stream","");
      HTTPRequest::WriteHeader(req,(string *)local_b8,(string *)local_d8);
      if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
      }
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
      }
      reply_01._M_ptr =
           (pointer)(CONCAT44(local_138._4_4_,local_138._0_4_) +
                    CONCAT71(local_128._9_7_,local_128[8]));
      reply_01._M_extent._M_extent_value = CONCAT71(uStack_12f,bStack_130) - (long)reply_01._M_ptr;
      HTTPRequest::WriteReply(req,200,reply_01);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_138);
    }
    else if (RVar7 == HEX) {
      local_138 = (undefined1  [8])local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"Content-Type","");
      pcVar1 = local_b8 + 0x10;
      local_b8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"text/plain","");
      HTTPRequest::WriteHeader(req,(string *)local_138,(string *)local_b8);
      if ((pointer)local_b8._0_8_ != pcVar1) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
      }
      if (local_138 != (undefined1  [8])local_128) {
        operator_delete((void *)local_138,local_128._0_8_ + 1);
      }
      puVar4 = pCVar15->phashBlock;
      if (puVar4 == (uint256 *)0x0) goto LAB_0029658f;
      local_d8._0_8_ = *(undefined8 *)&puVar4->super_base_blob<256U>;
      local_d8._8_8_ = *(undefined8 *)((long)&puVar4->super_base_blob<256U> + 8);
      local_d8._16_8_ = *(undefined8 *)((long)&puVar4->super_base_blob<256U> + 0x10);
      auStack_c0 = *(undefined1 (*) [8])((long)&puVar4->super_base_blob<256U> + 0x18);
      base_blob<256u>::GetHex_abi_cxx11_((string *)local_b8,local_d8);
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,"\n");
      local_138 = (undefined1  [8])(pbVar10->_M_dataplus)._M_p;
      paVar11 = &pbVar10->field_2;
      if (local_138 == (undefined1  [8])paVar11) {
        local_128._0_8_ = paVar11->_M_allocated_capacity;
        uVar18 = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        local_128[8] = (undefined1)uVar18;
        local_128._9_7_ = (undefined7)((ulong)uVar18 >> 8);
        local_138 = (undefined1  [8])local_128;
      }
      else {
        local_128._0_8_ = paVar11->_M_allocated_capacity;
      }
      bStack_130 = SUB81(pbVar10->_M_string_length,0);
      uStack_12f = (undefined7)(pbVar10->_M_string_length >> 8);
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      reply._M_extent._M_extent_value._0_1_ = bStack_130;
      reply._M_ptr = (pointer)local_138;
      reply._M_extent._M_extent_value._1_7_ = uStack_12f;
      HTTPRequest::WriteReply(req,200,reply);
      pcVar14 = (pointer)local_b8._0_8_;
      if (local_138 != (undefined1  [8])local_128) {
        operator_delete((void *)local_138,local_128._0_8_ + 1);
        pcVar14 = (pointer)local_b8._0_8_;
      }
      sVar12 = local_b8._16_8_;
      local_b8._0_8_ = pcVar14;
      if (pcVar14 != pcVar1) {
LAB_00296580:
        operator_delete(pcVar14,sVar12 + 1);
      }
    }
    else {
      if (RVar7 != JSON) {
        AvailableDataFormatsString_abi_cxx11_();
        pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_b8,0,0,"output format not found (available: ",0x24);
        local_138 = (undefined1  [8])(pbVar10->_M_dataplus)._M_p;
        paVar11 = &pbVar10->field_2;
        if (local_138 == (undefined1  [8])paVar11) {
          local_128._0_8_ = paVar11->_M_allocated_capacity;
          uVar18 = *(undefined8 *)((long)&pbVar10->field_2 + 8);
          local_128[8] = (undefined1)uVar18;
          local_128._9_7_ = (undefined7)((ulong)uVar18 >> 8);
          local_138 = (undefined1  [8])local_128;
        }
        else {
          local_128._0_8_ = paVar11->_M_allocated_capacity;
        }
        bStack_130 = SUB81(pbVar10->_M_string_length,0);
        uStack_12f = (undefined7)(pbVar10->_M_string_length >> 8);
        (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
        pbVar10->_M_string_length = 0;
        (pbVar10->field_2)._M_local_buf[0] = '\0';
        pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,")");
        _Var17._M_p = (pbVar10->_M_dataplus)._M_p;
        paVar11 = &pbVar10->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var17._M_p == paVar11) {
          uVar18 = paVar11->_M_allocated_capacity;
          _Var17._M_p = &stack0xfffffffffffffe20;
        }
        else {
          uVar18 = paVar11->_M_allocated_capacity;
        }
        (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
        pbVar10->_M_string_length = 0;
        (pbVar10->field_2)._M_local_buf[0] = '\0';
        RESTERR(req,HTTP_NOT_FOUND,(string *)&stack0xfffffffffffffe10);
        if (_Var17._M_p != &stack0xfffffffffffffe20) {
          operator_delete(_Var17._M_p,uVar18 + 1);
        }
        if (local_138 != (undefined1  [8])local_128) {
          operator_delete((void *)local_138,local_128._0_8_ + 1);
        }
        pmVar13 = (mutex_type *)CONCAT44(local_b8._4_4_,local_b8._0_4_);
        sVar12 = local_b8._16_8_;
        if (pmVar13 != (mutex_type *)(local_b8 + 0x10)) goto LAB_00295dac;
        goto LAB_0029640e;
      }
      local_138 = (undefined1  [8])local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"Content-Type","");
      pcVar1 = local_b8 + 0x10;
      local_b8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"application/json","");
      HTTPRequest::WriteHeader(req,(string *)local_138,(string *)local_b8);
      auVar5 = local_138;
      if ((pointer)local_b8._0_8_ != pcVar1) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
        auVar5 = local_138;
      }
      local_138._4_4_ = (undefined4)((ulong)auVar5 >> 0x20);
      if (auVar5 != (undefined1  [8])local_128) {
        local_138 = auVar5;
        operator_delete((void *)auVar5,local_128._0_8_ + 1);
      }
      local_158 = local_148;
      local_150 = 0;
      pcVar2 = local_128 + 8;
      local_138._0_4_ = VOBJ;
      bStack_130 = SUB81(pcVar2,0);
      uStack_12f = (undefined7)((ulong)pcVar2 >> 8);
      local_128[8] = '\0';
      local_128._9_7_ = (undefined7)local_148._1_8_;
      local_128[0x10] = SUB81(local_148._1_8_,7);
      local_128._17_4_ = local_13f;
      local_128._21_2_ = local_13b;
      local_128[0x17] = local_139;
      local_128._0_8_ = 0;
      local_148[0] = 0;
      local_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_f8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_178[0] = local_168;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"blockhash","");
      puVar4 = pCVar15->phashBlock;
      if (puVar4 == (uint256 *)0x0) goto LAB_0029658f;
      local_d8._0_8_ = *(undefined8 *)&puVar4->super_base_blob<256U>;
      local_d8._8_8_ = *(undefined8 *)((long)&puVar4->super_base_blob<256U> + 8);
      local_d8._16_8_ = *(undefined8 *)((long)&puVar4->super_base_blob<256U> + 0x10);
      auStack_c0 = *(undefined1 (*) [8])((long)&puVar4->super_base_blob<256U> + 0x18);
      base_blob<256u>::GetHex_abi_cxx11_((string *)local_b8,local_d8);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((UniValue *)&stack0xfffffffffffffe30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      key._M_dataplus._M_p._4_4_ = uVar16;
      key._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe08;
      key._M_string_length = (size_type)in_stack_fffffffffffffe10._M_p;
      key.field_2._M_allocated_capacity = in_stack_fffffffffffffe18;
      key.field_2._8_8_ = in_stack_fffffffffffffe20;
      val.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe30;
      val._0_8_ = in_stack_fffffffffffffe28;
      val.val._M_string_length = (size_type)in_stack_fffffffffffffe38._M_p;
      val.val.field_2._M_allocated_capacity = in_stack_fffffffffffffe40;
      val.val.field_2._8_8_ = in_stack_fffffffffffffe48;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data =
           (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )in_stack_fffffffffffffe50._0_24_;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data =
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)
           (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffe50._24_24_;
      UniValue::pushKV((UniValue *)local_138,key,val);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffe70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xfffffffffffffe58);
      if (in_stack_fffffffffffffe38._M_p != &stack0xfffffffffffffe48) {
        operator_delete(in_stack_fffffffffffffe38._M_p,in_stack_fffffffffffffe48 + 1);
      }
      if ((pointer)local_b8._0_8_ != pcVar1) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
      }
      if (local_178[0] != local_168) {
        operator_delete(local_178[0],local_168[0] + 1);
      }
      UniValue::write_abi_cxx11_((UniValue *)local_d8,(int)local_138,(void *)0x0,0);
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,"\n");
      local_b8._0_8_ = (pbVar10->_M_dataplus)._M_p;
      paVar11 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._0_8_ == paVar11) {
        local_b8._16_8_ = paVar11->_M_allocated_capacity;
        local_b8._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        local_b8._0_8_ = pcVar1;
      }
      else {
        local_b8._16_8_ = paVar11->_M_allocated_capacity;
      }
      local_b8._8_4_ = (undefined4)pbVar10->_M_string_length;
      local_b8._12_4_ = (undefined4)(pbVar10->_M_string_length >> 0x20);
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      reply_00._M_extent._M_extent_value._0_4_ = local_b8._8_4_;
      reply_00._M_ptr = (pointer)local_b8._0_8_;
      reply_00._M_extent._M_extent_value._4_4_ = local_b8._12_4_;
      HTTPRequest::WriteReply(req,200,reply_00);
      if ((pointer)local_b8._0_8_ != pcVar1) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
      }
      if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_110);
      pcVar14 = (pointer)CONCAT71(uStack_12f,bStack_130);
      if (pcVar14 != pcVar2) {
        sVar12 = CONCAT71(local_128._9_7_,local_128[8]);
        goto LAB_00296580;
      }
    }
    bVar6 = true;
  }
  else {
    str_00._M_str = local_58._M_dataplus._M_p;
    str_00._M_len = local_58._M_string_length;
    SanitizeString_abi_cxx11_((string *)local_138,str_00,0);
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138
                      ,0,0,"Invalid height: ",0x10);
    local_78._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
    paVar11 = &pbVar10->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == paVar11) {
      local_78.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    }
    else {
      local_78.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    }
    local_78._M_string_length = pbVar10->_M_string_length;
    (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar10->_M_string_length = 0;
    (pbVar10->field_2)._M_local_buf[0] = '\0';
    RESTERR(req,HTTP_BAD_REQUEST,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    pmVar13 = (mutex_type *)CONCAT44(local_138._4_4_,local_138._0_4_);
    sVar12 = local_128._0_8_;
    local_138 = (undefined1  [8])pmVar13;
    if (pmVar13 != (mutex_type *)local_128) {
LAB_00295dac:
      operator_delete(pmVar13,sVar12 + 1);
    }
LAB_0029640e:
    bVar6 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
LAB_0029642d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

static bool rest_blockhash_by_height(const std::any& context, HTTPRequest* req,
                       const std::string& str_uri_part)
{
    if (!CheckWarmup(req)) return false;
    std::string height_str;
    const RESTResponseFormat rf = ParseDataFormat(height_str, str_uri_part);

    int32_t blockheight = -1; // Initialization done only to prevent valgrind false positive, see https://github.com/bitcoin/bitcoin/pull/18785
    if (!ParseInt32(height_str, &blockheight) || blockheight < 0) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid height: " + SanitizeString(height_str));
    }

    CBlockIndex* pblockindex = nullptr;
    {
        ChainstateManager* maybe_chainman = GetChainman(context, req);
        if (!maybe_chainman) return false;
        ChainstateManager& chainman = *maybe_chainman;
        LOCK(cs_main);
        const CChain& active_chain = chainman.ActiveChain();
        if (blockheight > active_chain.Height()) {
            return RESTERR(req, HTTP_NOT_FOUND, "Block height out of range");
        }
        pblockindex = active_chain[blockheight];
    }
    switch (rf) {
    case RESTResponseFormat::BINARY: {
        DataStream ss_blockhash{};
        ss_blockhash << pblockindex->GetBlockHash();
        req->WriteHeader("Content-Type", "application/octet-stream");
        req->WriteReply(HTTP_OK, ss_blockhash);
        return true;
    }
    case RESTResponseFormat::HEX: {
        req->WriteHeader("Content-Type", "text/plain");
        req->WriteReply(HTTP_OK, pblockindex->GetBlockHash().GetHex() + "\n");
        return true;
    }
    case RESTResponseFormat::JSON: {
        req->WriteHeader("Content-Type", "application/json");
        UniValue resp = UniValue(UniValue::VOBJ);
        resp.pushKV("blockhash", pblockindex->GetBlockHash().GetHex());
        req->WriteReply(HTTP_OK, resp.write() + "\n");
        return true;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }
}